

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void iadst8x8_new_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  __m128i *in_R8;
  uint in_R9D;
  undefined4 in_register_0000008c;
  int iVar70;
  int iVar73;
  int iVar74;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar75;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in1_07;
  __m128i in1_08;
  __m128i in1_09;
  __m128i in1_10;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in0_07;
  __m128i in0_08;
  __m128i in0_09;
  __m128i in0_10;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int log_range_out;
  __m128i x;
  __m128i v [8];
  __m128i u [8];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i kZero;
  __m128i rnding;
  __m128i cospi32;
  __m128i cospim48;
  __m128i cospi48;
  __m128i cospi16;
  __m128i cospi12;
  __m128i cospi52;
  __m128i cospi28;
  __m128i cospi36;
  __m128i cospi44;
  __m128i cospi20;
  __m128i cospi60;
  __m128i cospi4;
  int32_t *cospi;
  __m128i *in_stack_fffffffffffff0f8;
  undefined4 in_stack_fffffffffffff100;
  int iVar76;
  undefined8 uVar77;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  int local_ecc;
  undefined1 local_ec8 [16];
  undefined1 local_eb8 [16];
  undefined1 local_ea8 [16];
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  int local_d8c;
  undefined8 local_d88;
  undefined8 uStack_d80;
  int local_d78;
  int iStack_d74;
  int iStack_d70;
  int iStack_d6c;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  int32_t *local_ca8;
  uint local_ca0;
  int local_c9c;
  int local_c98;
  uint local_c94;
  undefined8 *local_c90;
  undefined1 (*local_c88) [16];
  uint local_c7c;
  undefined8 local_c78;
  undefined8 uStack_c70;
  uint local_c5c;
  undefined8 local_c58;
  undefined8 uStack_c50;
  uint local_c3c;
  undefined8 local_c38;
  undefined8 uStack_c30;
  uint local_c1c;
  undefined8 local_c18;
  undefined8 uStack_c10;
  uint local_bfc;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  uint local_bdc;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  uint local_bbc;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  uint local_b9c;
  undefined8 local_b98;
  undefined8 uStack_b90;
  uint local_b7c;
  undefined8 local_b78;
  undefined8 uStack_b70;
  uint local_b5c;
  undefined8 local_b58;
  undefined8 uStack_b50;
  uint local_b3c;
  undefined8 local_b38;
  undefined8 uStack_b30;
  uint local_b1c;
  undefined8 local_b18;
  undefined8 uStack_b10;
  uint local_afc;
  undefined8 local_af8;
  undefined8 uStack_af0;
  uint local_adc;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  uint local_abc;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  uint local_a9c;
  undefined8 local_a98;
  undefined8 uStack_a90;
  int local_a88;
  int iStack_a84;
  int iStack_a80;
  int iStack_a7c;
  undefined8 local_a78;
  undefined8 uStack_a70;
  int local_a68;
  int iStack_a64;
  int iStack_a60;
  int iStack_a5c;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  int local_a28;
  int iStack_a24;
  int iStack_a20;
  int iStack_a1c;
  undefined8 local_a18;
  undefined8 uStack_a10;
  int local_a08;
  int iStack_a04;
  int iStack_a00;
  int iStack_9fc;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  int local_9c8;
  int iStack_9c4;
  int iStack_9c0;
  int iStack_9bc;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  int local_9a8;
  int iStack_9a4;
  int iStack_9a0;
  int iStack_99c;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  int local_968;
  int iStack_964;
  int iStack_960;
  int iStack_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  int local_948;
  int iStack_944;
  int iStack_940;
  int iStack_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  int local_908;
  int iStack_904;
  int iStack_900;
  int iStack_8fc;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  int local_8a8;
  int iStack_8a4;
  int iStack_8a0;
  int iStack_89c;
  undefined8 local_898;
  undefined8 uStack_890;
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  int local_848;
  int iStack_844;
  int iStack_840;
  int iStack_83c;
  undefined8 local_838;
  undefined8 uStack_830;
  int local_828;
  int iStack_824;
  int iStack_820;
  int iStack_81c;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  int local_7e8;
  int iStack_7e4;
  int iStack_7e0;
  int iStack_7dc;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  int local_7c8;
  int iStack_7c4;
  int iStack_7c0;
  int iStack_7bc;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  int local_788;
  int iStack_784;
  int iStack_780;
  int iStack_77c;
  int local_728;
  int iStack_724;
  int iStack_720;
  int iStack_71c;
  int local_718;
  int iStack_714;
  int iStack_710;
  int iStack_70c;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  int32_t local_5d8;
  int local_5d4;
  int32_t local_5d0;
  int32_t local_5cc;
  int32_t local_5c8;
  int32_t local_5c4;
  int32_t local_5c0;
  int32_t local_5bc;
  int32_t local_5b8;
  int32_t local_5b4;
  int32_t local_5b0;
  int32_t local_5ac;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  int32_t local_218;
  int32_t local_214;
  int32_t local_210;
  int32_t local_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  int32_t local_1f8;
  int32_t local_1f4;
  int32_t local_1f0;
  int32_t local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  int32_t local_1d8;
  int32_t local_1d4;
  int32_t local_1d0;
  int32_t local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  int32_t local_1b8;
  int32_t local_1b4;
  int32_t local_1b0;
  int32_t local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  int32_t local_198;
  int32_t local_194;
  int32_t local_190;
  int32_t local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  int32_t local_178;
  int32_t local_174;
  int32_t local_170;
  int32_t local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  int32_t local_158;
  int32_t local_154;
  int32_t local_150;
  int32_t local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  int32_t local_138;
  int32_t local_134;
  int32_t local_130;
  int32_t local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  int32_t local_118;
  int32_t local_114;
  int32_t local_110;
  int32_t local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  int32_t local_f8;
  int32_t local_f4;
  int32_t local_f0;
  int32_t local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int32_t local_b8;
  int32_t local_b4;
  int32_t local_b0;
  int32_t local_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_c9c = (int)in_R8;
  local_ca0 = in_R9D;
  local_c98 = in_ECX;
  local_c94 = in_EDX;
  local_c90 = in_RSI;
  local_c88 = in_RDI;
  local_ca8 = cospi_arr(in_EDX);
  local_5ac = local_ca8[4];
  local_cb8 = CONCAT44(local_5ac,local_5ac);
  uStack_cb0 = CONCAT44(local_5ac,local_5ac);
  local_5b0 = local_ca8[0x3c];
  local_cc8 = CONCAT44(local_5b0,local_5b0);
  uStack_cc0 = CONCAT44(local_5b0,local_5b0);
  local_5b4 = local_ca8[0x14];
  local_cd8 = CONCAT44(local_5b4,local_5b4);
  uStack_cd0 = CONCAT44(local_5b4,local_5b4);
  local_5b8 = local_ca8[0x2c];
  local_ce8 = CONCAT44(local_5b8,local_5b8);
  uStack_ce0 = CONCAT44(local_5b8,local_5b8);
  local_5bc = local_ca8[0x24];
  local_cf8 = CONCAT44(local_5bc,local_5bc);
  uStack_cf0 = CONCAT44(local_5bc,local_5bc);
  local_5c0 = local_ca8[0x1c];
  local_d08 = CONCAT44(local_5c0,local_5c0);
  uStack_d00 = CONCAT44(local_5c0,local_5c0);
  local_5c4 = local_ca8[0x34];
  local_d18 = CONCAT44(local_5c4,local_5c4);
  uStack_d10 = CONCAT44(local_5c4,local_5c4);
  local_5c8 = local_ca8[0xc];
  local_d28 = CONCAT44(local_5c8,local_5c8);
  uStack_d20 = CONCAT44(local_5c8,local_5c8);
  local_5cc = local_ca8[0x10];
  local_d38 = CONCAT44(local_5cc,local_5cc);
  uStack_d30 = CONCAT44(local_5cc,local_5cc);
  local_5d0 = local_ca8[0x30];
  local_d48 = CONCAT44(local_5d0,local_5d0);
  uStack_d40 = CONCAT44(local_5d0,local_5d0);
  local_5d4 = -local_ca8[0x30];
  local_d58 = CONCAT44(local_5d4,local_5d4);
  uStack_d50 = CONCAT44(local_5d4,local_5d4);
  local_5d8 = local_ca8[0x20];
  local_d68 = CONCAT44(local_5d8,local_5d8);
  uStack_d60 = CONCAT44(local_5d8,local_5d8);
  local_5dc = 1 << ((char)local_c94 - 1U & 0x1f);
  local_608 = 0;
  uStack_600 = 0;
  local_d88 = 0;
  uStack_d80 = 0;
  iVar76 = 8;
  if (local_c98 != 0) {
    iVar76 = 6;
  }
  if (local_c9c + iVar76 < 0x10) {
    iVar76 = 0x10;
  }
  else {
    iVar76 = 8;
    if (local_c98 != 0) {
      iVar76 = 6;
    }
    iVar76 = local_c9c + iVar76;
  }
  local_d8c._0_1_ = (char)iVar76;
  local_5e0 = -(1 << ((char)local_d8c - 1U & 0x1f));
  local_da8 = CONCAT44(local_5e0,local_5e0);
  uStack_da0 = CONCAT44(local_5e0,local_5e0);
  local_5e4 = (1 << ((char)local_d8c - 1U & 0x1f)) + -1;
  local_db8 = CONCAT44(local_5e4,local_5e4);
  uStack_db0 = CONCAT44(local_5e4,local_5e4);
  local_238 = *(undefined8 *)local_c88[7];
  uStack_230 = *(undefined8 *)(local_c88[7] + 8);
  auVar38._8_8_ = uStack_cb0;
  auVar38._0_8_ = local_cb8;
  auVar71 = pmulld(local_c88[7],auVar38);
  local_258 = *(undefined8 *)*local_c88;
  uStack_250 = *(undefined8 *)(*local_c88 + 8);
  auVar37._8_8_ = uStack_cc0;
  auVar37._0_8_ = local_cc8;
  auVar72 = pmulld(*local_c88,auVar37);
  local_e38 = auVar71._0_8_;
  uStack_e30 = auVar71._8_8_;
  local_ec8._0_8_ = auVar72._0_8_;
  local_ec8._8_8_ = auVar72._8_8_;
  local_798 = local_e38;
  uVar52 = local_798;
  uStack_790 = uStack_e30;
  uVar53 = uStack_790;
  local_7a8 = local_ec8._0_8_;
  uVar50 = local_7a8;
  uStack_7a0 = local_ec8._8_8_;
  uVar51 = uStack_7a0;
  local_798._0_4_ = auVar71._0_4_;
  local_798._4_4_ = auVar71._4_4_;
  uStack_790._0_4_ = auVar71._8_4_;
  uStack_790._4_4_ = auVar71._12_4_;
  local_7a8._0_4_ = auVar72._0_4_;
  local_7a8._4_4_ = auVar72._4_4_;
  uStack_7a0._0_4_ = auVar72._8_4_;
  uStack_7a0._4_4_ = auVar72._12_4_;
  local_e38 = CONCAT44(local_798._4_4_ + local_7a8._4_4_,(int)local_798 + (int)local_7a8);
  uStack_e30._0_4_ = (int)uStack_790 + (int)uStack_7a0;
  uStack_e30._4_4_ = uStack_790._4_4_ + uStack_7a0._4_4_;
  local_7b8 = local_e38;
  uStack_7b0 = uStack_e30;
  iVar70 = (int)local_798 + (int)local_7a8 + local_5dc;
  iVar73 = local_798._4_4_ + local_7a8._4_4_ + local_5dc;
  iVar74 = (int)uStack_790 + (int)uStack_7a0 + local_5dc;
  iVar75 = uStack_790._4_4_ + uStack_7a0._4_4_ + local_5dc;
  local_e38 = CONCAT44(iVar73,iVar70);
  uStack_e30._0_4_ = iVar74;
  uStack_e30._4_4_ = iVar75;
  local_a98 = local_e38;
  uStack_a90 = uStack_e30;
  local_a9c = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_e38._4_4_ = iVar73 >> auVar71;
  local_e38._0_4_ = iVar70 >> auVar71;
  uStack_e30._0_4_ = iVar74 >> auVar71;
  uStack_e30._4_4_ = iVar75 >> auVar71;
  local_278 = *(undefined8 *)local_c88[7];
  uStack_270 = *(undefined8 *)(local_c88[7] + 8);
  auVar36._8_8_ = uStack_cc0;
  auVar36._0_8_ = local_cc8;
  auVar71 = pmulld(local_c88[7],auVar36);
  local_298 = *(undefined8 *)*local_c88;
  uStack_290 = *(undefined8 *)(*local_c88 + 8);
  auVar35._8_8_ = uStack_cb0;
  auVar35._0_8_ = local_cb8;
  auVar72 = pmulld(*local_c88,auVar35);
  local_e28 = auVar71._0_8_;
  uStack_e20 = auVar71._8_8_;
  local_ec8._0_8_ = auVar72._0_8_;
  local_ec8._8_8_ = auVar72._8_8_;
  local_618 = local_e28;
  uVar68 = local_618;
  uStack_610 = uStack_e20;
  uVar69 = uStack_610;
  local_628 = local_ec8._0_8_;
  uVar66 = local_628;
  uStack_620 = local_ec8._8_8_;
  uVar67 = uStack_620;
  local_618._0_4_ = auVar71._0_4_;
  local_618._4_4_ = auVar71._4_4_;
  uStack_610._0_4_ = auVar71._8_4_;
  uStack_610._4_4_ = auVar71._12_4_;
  local_628._0_4_ = auVar72._0_4_;
  local_628._4_4_ = auVar72._4_4_;
  uStack_620._0_4_ = auVar72._8_4_;
  uStack_620._4_4_ = auVar72._12_4_;
  local_e28 = CONCAT44(local_618._4_4_ - local_628._4_4_,(int)local_618 - (int)local_628);
  uStack_e20._0_4_ = (int)uStack_610 - (int)uStack_620;
  uStack_e20._4_4_ = uStack_610._4_4_ - uStack_620._4_4_;
  local_7d8 = local_e28;
  uStack_7d0 = uStack_e20;
  iVar70 = ((int)local_618 - (int)local_628) + local_5dc;
  iVar73 = (local_618._4_4_ - local_628._4_4_) + local_5dc;
  iVar74 = ((int)uStack_610 - (int)uStack_620) + local_5dc;
  iVar75 = (uStack_610._4_4_ - uStack_620._4_4_) + local_5dc;
  local_e28 = CONCAT44(iVar73,iVar70);
  uStack_e20._0_4_ = iVar74;
  uStack_e20._4_4_ = iVar75;
  local_ab8 = local_e28;
  uStack_ab0 = uStack_e20;
  local_abc = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_e28._4_4_ = iVar73 >> auVar71;
  local_e28._0_4_ = iVar70 >> auVar71;
  uStack_e20._0_4_ = iVar74 >> auVar71;
  uStack_e20._4_4_ = iVar75 >> auVar71;
  local_2b8 = *(undefined8 *)local_c88[5];
  uStack_2b0 = *(undefined8 *)(local_c88[5] + 8);
  auVar34._8_8_ = uStack_cd0;
  auVar34._0_8_ = local_cd8;
  auVar71 = pmulld(local_c88[5],auVar34);
  local_2d8 = *(undefined8 *)local_c88[2];
  uStack_2d0 = *(undefined8 *)(local_c88[2] + 8);
  auVar33._8_8_ = uStack_ce0;
  auVar33._0_8_ = local_ce8;
  auVar72 = pmulld(local_c88[2],auVar33);
  local_e18 = auVar71._0_8_;
  uStack_e10 = auVar71._8_8_;
  local_ec8._0_8_ = auVar72._0_8_;
  local_ec8._8_8_ = auVar72._8_8_;
  local_7f8 = local_e18;
  uVar48 = local_7f8;
  uStack_7f0 = uStack_e10;
  uVar49 = uStack_7f0;
  local_808 = local_ec8._0_8_;
  uVar46 = local_808;
  uStack_800 = local_ec8._8_8_;
  uVar47 = uStack_800;
  local_7f8._0_4_ = auVar71._0_4_;
  local_7f8._4_4_ = auVar71._4_4_;
  uStack_7f0._0_4_ = auVar71._8_4_;
  uStack_7f0._4_4_ = auVar71._12_4_;
  local_808._0_4_ = auVar72._0_4_;
  local_808._4_4_ = auVar72._4_4_;
  uStack_800._0_4_ = auVar72._8_4_;
  uStack_800._4_4_ = auVar72._12_4_;
  local_e18 = CONCAT44(local_7f8._4_4_ + local_808._4_4_,(int)local_7f8 + (int)local_808);
  uStack_e10._0_4_ = (int)uStack_7f0 + (int)uStack_800;
  uStack_e10._4_4_ = uStack_7f0._4_4_ + uStack_800._4_4_;
  local_818 = local_e18;
  uStack_810 = uStack_e10;
  iVar70 = (int)local_7f8 + (int)local_808 + local_5dc;
  iVar73 = local_7f8._4_4_ + local_808._4_4_ + local_5dc;
  iVar74 = (int)uStack_7f0 + (int)uStack_800 + local_5dc;
  iVar75 = uStack_7f0._4_4_ + uStack_800._4_4_ + local_5dc;
  local_e18 = CONCAT44(iVar73,iVar70);
  uStack_e10._0_4_ = iVar74;
  uStack_e10._4_4_ = iVar75;
  local_ad8 = local_e18;
  uStack_ad0 = uStack_e10;
  local_adc = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_e18._4_4_ = iVar73 >> auVar71;
  local_e18._0_4_ = iVar70 >> auVar71;
  uStack_e10._0_4_ = iVar74 >> auVar71;
  uStack_e10._4_4_ = iVar75 >> auVar71;
  local_2f8 = *(undefined8 *)local_c88[5];
  uStack_2f0 = *(undefined8 *)(local_c88[5] + 8);
  auVar32._8_8_ = uStack_ce0;
  auVar32._0_8_ = local_ce8;
  auVar71 = pmulld(local_c88[5],auVar32);
  local_318 = *(undefined8 *)local_c88[2];
  uStack_310 = *(undefined8 *)(local_c88[2] + 8);
  auVar31._8_8_ = uStack_cd0;
  auVar31._0_8_ = local_cd8;
  auVar72 = pmulld(local_c88[2],auVar31);
  local_e08 = auVar71._0_8_;
  uStack_e00 = auVar71._8_8_;
  local_ec8._0_8_ = auVar72._0_8_;
  local_ec8._8_8_ = auVar72._8_8_;
  local_638 = local_e08;
  uVar64 = local_638;
  uStack_630 = uStack_e00;
  uVar65 = uStack_630;
  local_648 = local_ec8._0_8_;
  uVar62 = local_648;
  uStack_640 = local_ec8._8_8_;
  uVar63 = uStack_640;
  local_638._0_4_ = auVar71._0_4_;
  local_638._4_4_ = auVar71._4_4_;
  uStack_630._0_4_ = auVar71._8_4_;
  uStack_630._4_4_ = auVar71._12_4_;
  local_648._0_4_ = auVar72._0_4_;
  local_648._4_4_ = auVar72._4_4_;
  uStack_640._0_4_ = auVar72._8_4_;
  uStack_640._4_4_ = auVar72._12_4_;
  local_e08 = CONCAT44(local_638._4_4_ - local_648._4_4_,(int)local_638 - (int)local_648);
  uStack_e00._0_4_ = (int)uStack_630 - (int)uStack_640;
  uStack_e00._4_4_ = uStack_630._4_4_ - uStack_640._4_4_;
  local_838 = local_e08;
  uStack_830 = uStack_e00;
  iVar70 = ((int)local_638 - (int)local_648) + local_5dc;
  iVar73 = (local_638._4_4_ - local_648._4_4_) + local_5dc;
  iVar74 = ((int)uStack_630 - (int)uStack_640) + local_5dc;
  iVar75 = (uStack_630._4_4_ - uStack_640._4_4_) + local_5dc;
  local_e08 = CONCAT44(iVar73,iVar70);
  uStack_e00._0_4_ = iVar74;
  uStack_e00._4_4_ = iVar75;
  local_af8 = local_e08;
  uStack_af0 = uStack_e00;
  local_afc = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_e08._4_4_ = iVar73 >> auVar71;
  local_e08._0_4_ = iVar70 >> auVar71;
  uStack_e00._0_4_ = iVar74 >> auVar71;
  uStack_e00._4_4_ = iVar75 >> auVar71;
  local_338 = *(undefined8 *)local_c88[3];
  uStack_330 = *(undefined8 *)(local_c88[3] + 8);
  auVar30._8_8_ = uStack_cf0;
  auVar30._0_8_ = local_cf8;
  auVar71 = pmulld(local_c88[3],auVar30);
  local_358 = *(undefined8 *)local_c88[4];
  uStack_350 = *(undefined8 *)(local_c88[4] + 8);
  auVar29._8_8_ = uStack_d00;
  auVar29._0_8_ = local_d08;
  auVar72 = pmulld(local_c88[4],auVar29);
  local_df8 = auVar71._0_8_;
  uStack_df0 = auVar71._8_8_;
  local_ec8._0_8_ = auVar72._0_8_;
  local_ec8._8_8_ = auVar72._8_8_;
  local_858 = local_df8;
  uVar44 = local_858;
  uStack_850 = uStack_df0;
  uVar45 = uStack_850;
  local_868 = local_ec8._0_8_;
  uVar42 = local_868;
  uStack_860 = local_ec8._8_8_;
  uVar43 = uStack_860;
  local_858._0_4_ = auVar71._0_4_;
  local_858._4_4_ = auVar71._4_4_;
  uStack_850._0_4_ = auVar71._8_4_;
  uStack_850._4_4_ = auVar71._12_4_;
  local_868._0_4_ = auVar72._0_4_;
  local_868._4_4_ = auVar72._4_4_;
  uStack_860._0_4_ = auVar72._8_4_;
  uStack_860._4_4_ = auVar72._12_4_;
  local_df8 = CONCAT44(local_858._4_4_ + local_868._4_4_,(int)local_858 + (int)local_868);
  uStack_df0._0_4_ = (int)uStack_850 + (int)uStack_860;
  uStack_df0._4_4_ = uStack_850._4_4_ + uStack_860._4_4_;
  local_878 = local_df8;
  uStack_870 = uStack_df0;
  iVar70 = (int)local_858 + (int)local_868 + local_5dc;
  iVar73 = local_858._4_4_ + local_868._4_4_ + local_5dc;
  iVar74 = (int)uStack_850 + (int)uStack_860 + local_5dc;
  iVar75 = uStack_850._4_4_ + uStack_860._4_4_ + local_5dc;
  local_df8 = CONCAT44(iVar73,iVar70);
  uStack_df0._0_4_ = iVar74;
  uStack_df0._4_4_ = iVar75;
  local_b18 = local_df8;
  uStack_b10 = uStack_df0;
  local_b1c = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_df8._4_4_ = iVar73 >> auVar71;
  local_df8._0_4_ = iVar70 >> auVar71;
  uStack_df0._0_4_ = iVar74 >> auVar71;
  uStack_df0._4_4_ = iVar75 >> auVar71;
  local_378 = *(undefined8 *)local_c88[3];
  uStack_370 = *(undefined8 *)(local_c88[3] + 8);
  auVar28._8_8_ = uStack_d00;
  auVar28._0_8_ = local_d08;
  auVar71 = pmulld(local_c88[3],auVar28);
  local_398 = *(undefined8 *)local_c88[4];
  uStack_390 = *(undefined8 *)(local_c88[4] + 8);
  auVar27._8_8_ = uStack_cf0;
  auVar27._0_8_ = local_cf8;
  auVar72 = pmulld(local_c88[4],auVar27);
  local_de8 = auVar71._0_8_;
  uStack_de0 = auVar71._8_8_;
  local_ec8._0_8_ = auVar72._0_8_;
  local_ec8._8_8_ = auVar72._8_8_;
  local_658 = local_de8;
  uVar60 = local_658;
  uStack_650 = uStack_de0;
  uVar61 = uStack_650;
  local_668 = local_ec8._0_8_;
  uVar58 = local_668;
  uStack_660 = local_ec8._8_8_;
  uVar59 = uStack_660;
  local_658._0_4_ = auVar71._0_4_;
  local_658._4_4_ = auVar71._4_4_;
  uStack_650._0_4_ = auVar71._8_4_;
  uStack_650._4_4_ = auVar71._12_4_;
  local_668._0_4_ = auVar72._0_4_;
  local_668._4_4_ = auVar72._4_4_;
  uStack_660._0_4_ = auVar72._8_4_;
  uStack_660._4_4_ = auVar72._12_4_;
  local_de8 = CONCAT44(local_658._4_4_ - local_668._4_4_,(int)local_658 - (int)local_668);
  uStack_de0._0_4_ = (int)uStack_650 - (int)uStack_660;
  uStack_de0._4_4_ = uStack_650._4_4_ - uStack_660._4_4_;
  local_898 = local_de8;
  uStack_890 = uStack_de0;
  iVar70 = ((int)local_658 - (int)local_668) + local_5dc;
  iVar73 = (local_658._4_4_ - local_668._4_4_) + local_5dc;
  iVar74 = ((int)uStack_650 - (int)uStack_660) + local_5dc;
  iVar75 = (uStack_650._4_4_ - uStack_660._4_4_) + local_5dc;
  local_de8 = CONCAT44(iVar73,iVar70);
  uStack_de0._0_4_ = iVar74;
  uStack_de0._4_4_ = iVar75;
  local_b38 = local_de8;
  uStack_b30 = uStack_de0;
  local_b3c = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_de8._4_4_ = iVar73 >> auVar71;
  local_de8._0_4_ = iVar70 >> auVar71;
  uStack_de0._0_4_ = iVar74 >> auVar71;
  uStack_de0._4_4_ = iVar75 >> auVar71;
  local_3b8 = *(undefined8 *)local_c88[1];
  uStack_3b0 = *(undefined8 *)(local_c88[1] + 8);
  auVar26._8_8_ = uStack_d10;
  auVar26._0_8_ = local_d18;
  auVar71 = pmulld(local_c88[1],auVar26);
  local_3d8 = *(undefined8 *)local_c88[6];
  uStack_3d0 = *(undefined8 *)(local_c88[6] + 8);
  auVar25._8_8_ = uStack_d20;
  auVar25._0_8_ = local_d28;
  auVar72 = pmulld(local_c88[6],auVar25);
  local_dd8 = auVar71._0_8_;
  uStack_dd0 = auVar71._8_8_;
  local_ec8._0_8_ = auVar72._0_8_;
  local_ec8._8_8_ = auVar72._8_8_;
  local_8b8 = local_dd8;
  uVar40 = local_8b8;
  uStack_8b0 = uStack_dd0;
  uVar41 = uStack_8b0;
  local_8c8 = local_ec8._0_8_;
  uVar77 = local_8c8;
  uStack_8c0 = local_ec8._8_8_;
  uVar39 = uStack_8c0;
  local_8b8._0_4_ = auVar71._0_4_;
  local_8b8._4_4_ = auVar71._4_4_;
  uStack_8b0._0_4_ = auVar71._8_4_;
  uStack_8b0._4_4_ = auVar71._12_4_;
  local_8c8._0_4_ = auVar72._0_4_;
  local_8c8._4_4_ = auVar72._4_4_;
  uStack_8c0._0_4_ = auVar72._8_4_;
  uStack_8c0._4_4_ = auVar72._12_4_;
  local_dd8 = CONCAT44(local_8b8._4_4_ + local_8c8._4_4_,(int)local_8b8 + (int)local_8c8);
  uStack_dd0._0_4_ = (int)uStack_8b0 + (int)uStack_8c0;
  uStack_dd0._4_4_ = uStack_8b0._4_4_ + uStack_8c0._4_4_;
  local_8d8 = local_dd8;
  uStack_8d0 = uStack_dd0;
  iVar70 = (int)local_8b8 + (int)local_8c8 + local_5dc;
  iVar73 = local_8b8._4_4_ + local_8c8._4_4_ + local_5dc;
  iVar74 = (int)uStack_8b0 + (int)uStack_8c0 + local_5dc;
  iVar75 = uStack_8b0._4_4_ + uStack_8c0._4_4_ + local_5dc;
  local_dd8 = CONCAT44(iVar73,iVar70);
  uStack_dd0._0_4_ = iVar74;
  uStack_dd0._4_4_ = iVar75;
  local_b58 = local_dd8;
  uStack_b50 = uStack_dd0;
  local_b5c = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_dd8._4_4_ = iVar73 >> auVar71;
  local_dd8._0_4_ = iVar70 >> auVar71;
  uStack_dd0._0_4_ = iVar74 >> auVar71;
  uStack_dd0._4_4_ = iVar75 >> auVar71;
  local_3f8 = *(undefined8 *)local_c88[1];
  uStack_3f0 = *(undefined8 *)(local_c88[1] + 8);
  auVar24._8_8_ = uStack_d20;
  auVar24._0_8_ = local_d28;
  auVar71 = pmulld(local_c88[1],auVar24);
  local_418 = *(undefined8 *)local_c88[6];
  uStack_410 = *(undefined8 *)(local_c88[6] + 8);
  auVar23._8_8_ = uStack_d10;
  auVar23._0_8_ = local_d18;
  local_ec8 = pmulld(local_c88[6],auVar23);
  local_dc8 = auVar71._0_8_;
  uStack_dc0 = auVar71._8_8_;
  local_678 = local_dc8;
  uVar56 = local_678;
  uStack_670 = uStack_dc0;
  uVar57 = uStack_670;
  local_688 = local_ec8._0_8_;
  uVar54 = local_688;
  uStack_680 = local_ec8._8_8_;
  uVar55 = uStack_680;
  local_678._0_4_ = auVar71._0_4_;
  local_678._4_4_ = auVar71._4_4_;
  uStack_670._0_4_ = auVar71._8_4_;
  uStack_670._4_4_ = auVar71._12_4_;
  local_688._0_4_ = local_ec8._0_4_;
  local_688._4_4_ = local_ec8._4_4_;
  uStack_680._0_4_ = local_ec8._8_4_;
  uStack_680._4_4_ = local_ec8._12_4_;
  local_dc8 = CONCAT44(local_678._4_4_ - local_688._4_4_,(int)local_678 - (int)local_688);
  uStack_dc0._0_4_ = (int)uStack_670 - (int)uStack_680;
  uStack_dc0._4_4_ = uStack_670._4_4_ - uStack_680._4_4_;
  local_8f8 = local_dc8;
  uStack_8f0 = uStack_dc0;
  iVar70 = ((int)local_678 - (int)local_688) + local_5dc;
  iVar73 = (local_678._4_4_ - local_688._4_4_) + local_5dc;
  iVar74 = ((int)uStack_670 - (int)uStack_680) + local_5dc;
  iVar75 = (uStack_670._4_4_ - uStack_680._4_4_) + local_5dc;
  local_dc8 = CONCAT44(iVar73,iVar70);
  uStack_dc0._0_4_ = iVar74;
  uStack_dc0._4_4_ = iVar75;
  local_b78 = local_dc8;
  uStack_b70 = uStack_dc0;
  local_b7c = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_dc8._4_4_ = iVar73 >> auVar71;
  local_dc8._0_4_ = iVar70 >> auVar71;
  uStack_dc0._0_4_ = iVar74 >> auVar71;
  uStack_dc0._4_4_ = iVar75 >> auVar71;
  in0[1] = &local_e78;
  in1[1] = (longlong)&local_db8;
  in1[0] = (longlong)&local_da8;
  in0[0] = (longlong)local_eb8;
  local_d8c = iVar76;
  local_8c8 = uVar77;
  uStack_8c0 = uVar39;
  local_8b8 = uVar40;
  uStack_8b0 = uVar41;
  local_868 = uVar42;
  uStack_860 = uVar43;
  local_858 = uVar44;
  uStack_850 = uVar45;
  local_808 = uVar46;
  uStack_800 = uVar47;
  local_7f8 = uVar48;
  uStack_7f0 = uVar49;
  local_7a8 = uVar50;
  uStack_7a0 = uVar51;
  local_798 = uVar52;
  uStack_790 = uVar53;
  local_688 = uVar54;
  uStack_680 = uVar55;
  local_678 = uVar56;
  uStack_670 = uVar57;
  local_668 = uVar58;
  uStack_660 = uVar59;
  local_658 = uVar60;
  uStack_650 = uVar61;
  local_648 = uVar62;
  uStack_640 = uVar63;
  local_638 = uVar64;
  uStack_630 = uVar65;
  local_628 = uVar66;
  uStack_620 = uVar67;
  local_618 = uVar68;
  uStack_610 = uVar69;
  local_428 = local_d18;
  uStack_420 = uStack_d10;
  local_408 = local_d28;
  uStack_400 = uStack_d20;
  local_3e8 = local_d28;
  uStack_3e0 = uStack_d20;
  local_3c8 = local_d18;
  uStack_3c0 = uStack_d10;
  local_3a8 = local_cf8;
  uStack_3a0 = uStack_cf0;
  local_388 = local_d08;
  uStack_380 = uStack_d00;
  local_368 = local_d08;
  uStack_360 = uStack_d00;
  local_348 = local_cf8;
  uStack_340 = uStack_cf0;
  local_328 = local_cd8;
  uStack_320 = uStack_cd0;
  local_308 = local_ce8;
  uStack_300 = uStack_ce0;
  local_2e8 = local_ce8;
  uStack_2e0 = uStack_ce0;
  local_2c8 = local_cd8;
  uStack_2c0 = uStack_cd0;
  local_2a8 = local_cb8;
  uStack_2a0 = uStack_cb0;
  local_288 = local_cc8;
  uStack_280 = uStack_cc0;
  local_268 = local_cc8;
  uStack_260 = uStack_cc0;
  local_248 = local_cb8;
  uStack_240 = uStack_cb0;
  local_228 = local_cb8;
  uStack_220 = uStack_cb0;
  local_218 = local_5ac;
  local_214 = local_5ac;
  local_210 = local_5ac;
  local_20c = local_5ac;
  local_208 = local_cc8;
  uStack_200 = uStack_cc0;
  local_1f8 = local_5b0;
  local_1f4 = local_5b0;
  local_1f0 = local_5b0;
  local_1ec = local_5b0;
  local_1e8 = local_cd8;
  uStack_1e0 = uStack_cd0;
  local_1d8 = local_5b4;
  local_1d4 = local_5b4;
  local_1d0 = local_5b4;
  local_1cc = local_5b4;
  local_1c8 = local_ce8;
  uStack_1c0 = uStack_ce0;
  local_1b8 = local_5b8;
  local_1b4 = local_5b8;
  local_1b0 = local_5b8;
  local_1ac = local_5b8;
  local_1a8 = local_cf8;
  uStack_1a0 = uStack_cf0;
  local_198 = local_5bc;
  local_194 = local_5bc;
  local_190 = local_5bc;
  local_18c = local_5bc;
  local_188 = local_d08;
  uStack_180 = uStack_d00;
  local_178 = local_5c0;
  local_174 = local_5c0;
  local_170 = local_5c0;
  local_16c = local_5c0;
  local_168 = local_d18;
  uStack_160 = uStack_d10;
  local_158 = local_5c4;
  local_154 = local_5c4;
  local_150 = local_5c4;
  local_14c = local_5c4;
  local_148 = local_d28;
  uStack_140 = uStack_d20;
  local_138 = local_5c8;
  local_134 = local_5c8;
  local_130 = local_5c8;
  local_12c = local_5c8;
  local_128 = local_d38;
  uStack_120 = uStack_d30;
  local_118 = local_5cc;
  local_114 = local_5cc;
  local_110 = local_5cc;
  local_10c = local_5cc;
  local_108 = local_d48;
  uStack_100 = uStack_d40;
  local_f8 = local_5d0;
  local_f4 = local_5d0;
  local_f0 = local_5d0;
  local_ec = local_5d0;
  local_e8 = local_d58;
  uStack_e0 = uStack_d50;
  local_d8 = local_5d4;
  local_d4 = local_5d4;
  local_d0 = local_5d4;
  local_cc = local_5d4;
  local_c8 = local_d68;
  uStack_c0 = uStack_d60;
  local_b8 = local_5d8;
  local_b4 = local_5d8;
  local_b0 = local_5d8;
  local_ac = local_5d8;
  local_98 = local_5dc;
  local_94 = local_5dc;
  local_90 = local_5dc;
  local_8c = local_5dc;
  local_88 = local_da8;
  uStack_80 = uStack_da0;
  local_78 = local_5e0;
  local_74 = local_5e0;
  local_70 = local_5e0;
  local_6c = local_5e0;
  local_68 = local_db8;
  uStack_60 = uStack_db0;
  local_58 = local_5e4;
  local_54 = local_5e4;
  local_50 = local_5e4;
  local_4c = local_5e4;
  local_d78 = local_5dc;
  iStack_d74 = local_5dc;
  local_908 = local_5dc;
  iStack_904 = local_5dc;
  local_8e8 = local_5dc;
  iStack_8e4 = local_5dc;
  local_8a8 = local_5dc;
  iStack_8a4 = local_5dc;
  local_888 = local_5dc;
  iStack_884 = local_5dc;
  local_848 = local_5dc;
  iStack_844 = local_5dc;
  local_828 = local_5dc;
  iStack_824 = local_5dc;
  local_7e8 = local_5dc;
  iStack_7e4 = local_5dc;
  local_7c8 = local_5dc;
  iStack_7c4 = local_5dc;
  local_a8 = local_5dc;
  iStack_a4 = local_5dc;
  iStack_d70 = local_5dc;
  iStack_d6c = local_5dc;
  iStack_900 = local_5dc;
  iStack_8fc = local_5dc;
  iStack_8e0 = local_5dc;
  iStack_8dc = local_5dc;
  iStack_8a0 = local_5dc;
  iStack_89c = local_5dc;
  iStack_880 = local_5dc;
  iStack_87c = local_5dc;
  iStack_840 = local_5dc;
  iStack_83c = local_5dc;
  iStack_820 = local_5dc;
  iStack_81c = local_5dc;
  iStack_7e0 = local_5dc;
  iStack_7dc = local_5dc;
  iStack_7c0 = local_5dc;
  iStack_7bc = local_5dc;
  iStack_a0 = local_5dc;
  iStack_9c = local_5dc;
  addsub_sse4_1(in0,in1,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_fffffffffffff0f8,(__m128i *)CONCAT44(iVar76,in_stack_fffffffffffff100));
  in0_00[0] = local_ea8;
  in0_00[1] = &local_e68;
  in1_00[1] = (longlong)&local_db8;
  in1_00[0] = (longlong)&local_da8;
  addsub_sse4_1(in0_00,in1_00,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_fffffffffffff0f8,(__m128i *)CONCAT44(iVar76,in_stack_fffffffffffff100));
  in0_01[0] = &local_e98;
  in0_01[1] = &local_e58;
  in1_01[1] = (longlong)&local_db8;
  in1_01[0] = (longlong)&local_da8;
  addsub_sse4_1(in0_01,in1_01,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_fffffffffffff0f8,(__m128i *)CONCAT44(iVar76,in_stack_fffffffffffff100));
  in0_02[0] = &local_e88;
  in0_02[1] = &local_e48;
  in1_02[1] = (longlong)&local_db8;
  in1_02[0] = (longlong)&local_da8;
  addsub_sse4_1(in0_02,in1_02,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_fffffffffffff0f8,(__m128i *)CONCAT44(iVar76,in_stack_fffffffffffff100));
  local_e38 = local_eb8._0_8_;
  uStack_e30 = local_eb8._8_8_;
  local_438 = local_e78;
  uStack_430 = uStack_e70;
  local_448 = local_d38;
  uStack_440 = uStack_d30;
  auVar22._8_8_ = uStack_e70;
  auVar22._0_8_ = local_e78;
  auVar21._8_8_ = uStack_d30;
  auVar21._0_8_ = local_d38;
  auVar71 = pmulld(auVar22,auVar21);
  local_458 = local_e68;
  uStack_450 = uStack_e60;
  local_468 = local_d48;
  uStack_460 = uStack_d40;
  auVar20._8_8_ = uStack_e60;
  auVar20._0_8_ = local_e68;
  auVar19._8_8_ = uStack_d40;
  auVar19._0_8_ = local_d48;
  auVar72 = pmulld(auVar20,auVar19);
  local_df8 = auVar71._0_8_;
  uStack_df0 = auVar71._8_8_;
  local_ec8._0_8_ = auVar72._0_8_;
  local_ec8._8_8_ = auVar72._8_8_;
  local_918 = local_df8;
  uVar44 = local_918;
  uStack_910 = uStack_df0;
  uVar45 = uStack_910;
  local_928 = local_ec8._0_8_;
  uVar42 = local_928;
  uStack_920 = local_ec8._8_8_;
  uVar43 = uStack_920;
  local_918._0_4_ = auVar71._0_4_;
  local_918._4_4_ = auVar71._4_4_;
  uStack_910._0_4_ = auVar71._8_4_;
  uStack_910._4_4_ = auVar71._12_4_;
  local_928._0_4_ = auVar72._0_4_;
  local_928._4_4_ = auVar72._4_4_;
  uStack_920._0_4_ = auVar72._8_4_;
  uStack_920._4_4_ = auVar72._12_4_;
  local_df8 = CONCAT44(local_918._4_4_ + local_928._4_4_,(int)local_918 + (int)local_928);
  uStack_df0._0_4_ = (int)uStack_910 + (int)uStack_920;
  uStack_df0._4_4_ = uStack_910._4_4_ + uStack_920._4_4_;
  local_938 = local_df8;
  uStack_930 = uStack_df0;
  local_948 = local_d78;
  iStack_944 = iStack_d74;
  iStack_940 = iStack_d70;
  iStack_93c = iStack_d6c;
  iVar70 = (int)local_918 + (int)local_928 + local_d78;
  iVar73 = local_918._4_4_ + local_928._4_4_ + iStack_d74;
  iVar74 = (int)uStack_910 + (int)uStack_920 + iStack_d70;
  iVar75 = uStack_910._4_4_ + uStack_920._4_4_ + iStack_d6c;
  local_df8 = CONCAT44(iVar73,iVar70);
  uStack_df0._0_4_ = iVar74;
  uStack_df0._4_4_ = iVar75;
  local_b98 = local_df8;
  uStack_b90 = uStack_df0;
  local_b9c = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_df8._4_4_ = iVar73 >> auVar71;
  local_df8._0_4_ = iVar70 >> auVar71;
  uStack_df0._0_4_ = iVar74 >> auVar71;
  uStack_df0._4_4_ = iVar75 >> auVar71;
  local_478 = local_e78;
  uStack_470 = uStack_e70;
  local_488 = local_d48;
  uStack_480 = uStack_d40;
  auVar18._8_8_ = uStack_e70;
  auVar18._0_8_ = local_e78;
  auVar17._8_8_ = uStack_d40;
  auVar17._0_8_ = local_d48;
  auVar71 = pmulld(auVar18,auVar17);
  local_498 = local_e68;
  uStack_490 = uStack_e60;
  local_4a8 = local_d38;
  uStack_4a0 = uStack_d30;
  auVar16._8_8_ = uStack_e60;
  auVar16._0_8_ = local_e68;
  auVar15._8_8_ = uStack_d30;
  auVar15._0_8_ = local_d38;
  auVar72 = pmulld(auVar16,auVar15);
  local_de8 = auVar71._0_8_;
  uStack_de0 = auVar71._8_8_;
  local_ec8._0_8_ = auVar72._0_8_;
  local_ec8._8_8_ = auVar72._8_8_;
  local_698 = local_de8;
  uVar52 = local_698;
  uStack_690 = uStack_de0;
  uVar53 = uStack_690;
  local_6a8 = local_ec8._0_8_;
  uVar50 = local_6a8;
  uStack_6a0 = local_ec8._8_8_;
  uVar51 = uStack_6a0;
  local_698._0_4_ = auVar71._0_4_;
  local_698._4_4_ = auVar71._4_4_;
  uStack_690._0_4_ = auVar71._8_4_;
  uStack_690._4_4_ = auVar71._12_4_;
  local_6a8._0_4_ = auVar72._0_4_;
  local_6a8._4_4_ = auVar72._4_4_;
  uStack_6a0._0_4_ = auVar72._8_4_;
  uStack_6a0._4_4_ = auVar72._12_4_;
  local_de8 = CONCAT44(local_698._4_4_ - local_6a8._4_4_,(int)local_698 - (int)local_6a8);
  uStack_de0._0_4_ = (int)uStack_690 - (int)uStack_6a0;
  uStack_de0._4_4_ = uStack_690._4_4_ - uStack_6a0._4_4_;
  local_958 = local_de8;
  uStack_950 = uStack_de0;
  local_968 = local_d78;
  iStack_964 = iStack_d74;
  iStack_960 = iStack_d70;
  iStack_95c = iStack_d6c;
  iVar70 = ((int)local_698 - (int)local_6a8) + local_d78;
  iVar73 = (local_698._4_4_ - local_6a8._4_4_) + iStack_d74;
  iVar74 = ((int)uStack_690 - (int)uStack_6a0) + iStack_d70;
  iVar75 = (uStack_690._4_4_ - uStack_6a0._4_4_) + iStack_d6c;
  local_de8 = CONCAT44(iVar73,iVar70);
  uStack_de0._0_4_ = iVar74;
  uStack_de0._4_4_ = iVar75;
  local_bb8 = local_de8;
  uStack_bb0 = uStack_de0;
  local_bbc = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_de8._4_4_ = iVar73 >> auVar71;
  local_de8._0_4_ = iVar70 >> auVar71;
  uStack_de0._0_4_ = iVar74 >> auVar71;
  uStack_de0._4_4_ = iVar75 >> auVar71;
  local_4b8 = local_e58;
  uStack_4b0 = uStack_e50;
  local_4c8 = local_d58;
  uStack_4c0 = uStack_d50;
  auVar14._8_8_ = uStack_e50;
  auVar14._0_8_ = local_e58;
  auVar13._8_8_ = uStack_d50;
  auVar13._0_8_ = local_d58;
  auVar71 = pmulld(auVar14,auVar13);
  local_4d8 = local_e48;
  uStack_4d0 = uStack_e40;
  local_4e8 = local_d38;
  uStack_4e0 = uStack_d30;
  auVar12._8_8_ = uStack_e40;
  auVar12._0_8_ = local_e48;
  auVar11._8_8_ = uStack_d30;
  auVar11._0_8_ = local_d38;
  auVar72 = pmulld(auVar12,auVar11);
  local_dd8 = auVar71._0_8_;
  uStack_dd0 = auVar71._8_8_;
  local_ec8._0_8_ = auVar72._0_8_;
  local_ec8._8_8_ = auVar72._8_8_;
  local_978 = local_dd8;
  uVar40 = local_978;
  uStack_970 = uStack_dd0;
  uVar41 = uStack_970;
  local_988 = local_ec8._0_8_;
  uVar77 = local_988;
  uStack_980 = local_ec8._8_8_;
  uVar39 = uStack_980;
  local_978._0_4_ = auVar71._0_4_;
  local_978._4_4_ = auVar71._4_4_;
  uStack_970._0_4_ = auVar71._8_4_;
  uStack_970._4_4_ = auVar71._12_4_;
  local_988._0_4_ = auVar72._0_4_;
  local_988._4_4_ = auVar72._4_4_;
  uStack_980._0_4_ = auVar72._8_4_;
  uStack_980._4_4_ = auVar72._12_4_;
  local_dd8 = CONCAT44(local_978._4_4_ + local_988._4_4_,(int)local_978 + (int)local_988);
  uStack_dd0._0_4_ = (int)uStack_970 + (int)uStack_980;
  uStack_dd0._4_4_ = uStack_970._4_4_ + uStack_980._4_4_;
  local_998 = local_dd8;
  uStack_990 = uStack_dd0;
  local_9a8 = local_d78;
  iStack_9a4 = iStack_d74;
  iStack_9a0 = iStack_d70;
  iStack_99c = iStack_d6c;
  iVar70 = (int)local_978 + (int)local_988 + local_d78;
  iVar73 = local_978._4_4_ + local_988._4_4_ + iStack_d74;
  iVar74 = (int)uStack_970 + (int)uStack_980 + iStack_d70;
  iVar75 = uStack_970._4_4_ + uStack_980._4_4_ + iStack_d6c;
  local_dd8 = CONCAT44(iVar73,iVar70);
  uStack_dd0._0_4_ = iVar74;
  uStack_dd0._4_4_ = iVar75;
  local_bd8 = local_dd8;
  uStack_bd0 = uStack_dd0;
  local_bdc = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_dd8._4_4_ = iVar73 >> auVar71;
  local_dd8._0_4_ = iVar70 >> auVar71;
  uStack_dd0._0_4_ = iVar74 >> auVar71;
  uStack_dd0._4_4_ = iVar75 >> auVar71;
  local_4f8 = local_e58;
  uStack_4f0 = uStack_e50;
  local_508 = local_d38;
  uStack_500 = uStack_d30;
  auVar10._8_8_ = uStack_e50;
  auVar10._0_8_ = local_e58;
  auVar9._8_8_ = uStack_d30;
  auVar9._0_8_ = local_d38;
  auVar71 = pmulld(auVar10,auVar9);
  local_518 = local_e48;
  uStack_510 = uStack_e40;
  local_528 = local_d58;
  uStack_520 = uStack_d50;
  auVar8._8_8_ = uStack_e40;
  auVar8._0_8_ = local_e48;
  auVar7._8_8_ = uStack_d50;
  auVar7._0_8_ = local_d58;
  local_ec8 = pmulld(auVar8,auVar7);
  local_dc8 = auVar71._0_8_;
  uStack_dc0 = auVar71._8_8_;
  local_6b8 = local_dc8;
  uVar48 = local_6b8;
  uStack_6b0 = uStack_dc0;
  uVar49 = uStack_6b0;
  local_6c8 = local_ec8._0_8_;
  uVar46 = local_6c8;
  uStack_6c0 = local_ec8._8_8_;
  uVar47 = uStack_6c0;
  local_6b8._0_4_ = auVar71._0_4_;
  local_6b8._4_4_ = auVar71._4_4_;
  uStack_6b0._0_4_ = auVar71._8_4_;
  uStack_6b0._4_4_ = auVar71._12_4_;
  local_6c8._0_4_ = local_ec8._0_4_;
  local_6c8._4_4_ = local_ec8._4_4_;
  uStack_6c0._0_4_ = local_ec8._8_4_;
  uStack_6c0._4_4_ = local_ec8._12_4_;
  local_dc8 = CONCAT44(local_6b8._4_4_ - local_6c8._4_4_,(int)local_6b8 - (int)local_6c8);
  uStack_dc0._0_4_ = (int)uStack_6b0 - (int)uStack_6c0;
  uStack_dc0._4_4_ = uStack_6b0._4_4_ - uStack_6c0._4_4_;
  local_9b8 = local_dc8;
  uStack_9b0 = uStack_dc0;
  local_9c8 = local_d78;
  iStack_9c4 = iStack_d74;
  iStack_9c0 = iStack_d70;
  iStack_9bc = iStack_d6c;
  iVar70 = ((int)local_6b8 - (int)local_6c8) + local_d78;
  iVar73 = (local_6b8._4_4_ - local_6c8._4_4_) + iStack_d74;
  iVar74 = ((int)uStack_6b0 - (int)uStack_6c0) + iStack_d70;
  iVar75 = (uStack_6b0._4_4_ - uStack_6c0._4_4_) + iStack_d6c;
  local_dc8 = CONCAT44(iVar73,iVar70);
  uStack_dc0._0_4_ = iVar74;
  uStack_dc0._4_4_ = iVar75;
  local_bf8 = local_dc8;
  uStack_bf0 = uStack_dc0;
  local_bfc = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_dc8._4_4_ = iVar73 >> auVar71;
  local_dc8._0_4_ = iVar70 >> auVar71;
  uStack_dc0._0_4_ = iVar74 >> auVar71;
  uStack_dc0._4_4_ = iVar75 >> auVar71;
  in0_03[1] = &local_e98;
  in1_03[1] = (longlong)&local_db8;
  in1_03[0] = (longlong)&local_da8;
  in0_03[0] = (longlong)local_eb8;
  local_988 = uVar77;
  uStack_980 = uVar39;
  local_978 = uVar40;
  uStack_970 = uVar41;
  local_928 = uVar42;
  uStack_920 = uVar43;
  local_918 = uVar44;
  uStack_910 = uVar45;
  local_6c8 = uVar46;
  uStack_6c0 = uVar47;
  local_6b8 = uVar48;
  uStack_6b0 = uVar49;
  local_6a8 = uVar50;
  uStack_6a0 = uVar51;
  local_698 = uVar52;
  uStack_690 = uVar53;
  addsub_sse4_1(in0_03,in1_03,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_fffffffffffff0f8,(__m128i *)CONCAT44(iVar76,in_stack_fffffffffffff100));
  in0_04[0] = local_ea8;
  in0_04[1] = &local_e88;
  in1_04[1] = (longlong)&local_db8;
  in1_04[0] = (longlong)&local_da8;
  addsub_sse4_1(in0_04,in1_04,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_fffffffffffff0f8,(__m128i *)CONCAT44(iVar76,in_stack_fffffffffffff100));
  in0_05[0] = &local_e78;
  in0_05[1] = &local_e58;
  in1_05[1] = (longlong)&local_db8;
  in1_05[0] = (longlong)&local_da8;
  addsub_sse4_1(in0_05,in1_05,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_fffffffffffff0f8,(__m128i *)CONCAT44(iVar76,in_stack_fffffffffffff100));
  in0_06[0] = &local_e68;
  in0_06[1] = &local_e48;
  in1_06[1] = (longlong)&local_db8;
  in1_06[0] = (longlong)&local_da8;
  addsub_sse4_1(in0_06,in1_06,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_fffffffffffff0f8,(__m128i *)CONCAT44(iVar76,in_stack_fffffffffffff100));
  uVar77 = local_eb8._0_8_;
  uVar39 = local_eb8._8_8_;
  local_538 = local_e98;
  uStack_530 = uStack_e90;
  local_548 = local_d68;
  uStack_540 = uStack_d60;
  auVar6._8_8_ = uStack_e90;
  auVar6._0_8_ = local_e98;
  auVar5._8_8_ = uStack_d60;
  auVar5._0_8_ = local_d68;
  auVar71 = pmulld(auVar6,auVar5);
  local_558 = local_e88;
  uStack_550 = uStack_e80;
  local_568 = local_d68;
  uStack_560 = uStack_d60;
  auVar4._8_8_ = uStack_e80;
  auVar4._0_8_ = local_e88;
  auVar3._8_8_ = uStack_d60;
  auVar3._0_8_ = local_d68;
  auVar72 = pmulld(auVar4,auVar3);
  local_eb8._0_8_ = auVar71._0_8_;
  local_eb8._8_8_ = auVar71._8_8_;
  local_ec8._0_8_ = auVar72._0_8_;
  local_ec8._8_8_ = auVar72._8_8_;
  local_9d8 = local_eb8._0_8_;
  uVar46 = local_9d8;
  uStack_9d0 = local_eb8._8_8_;
  uVar47 = uStack_9d0;
  local_9e8 = local_ec8._0_8_;
  uVar44 = local_9e8;
  uStack_9e0 = local_ec8._8_8_;
  uVar45 = uStack_9e0;
  local_9d8._0_4_ = auVar71._0_4_;
  local_9d8._4_4_ = auVar71._4_4_;
  uStack_9d0._0_4_ = auVar71._8_4_;
  uStack_9d0._4_4_ = auVar71._12_4_;
  local_9e8._0_4_ = auVar72._0_4_;
  local_9e8._4_4_ = auVar72._4_4_;
  uStack_9e0._0_4_ = auVar72._8_4_;
  uStack_9e0._4_4_ = auVar72._12_4_;
  local_e18 = CONCAT44(local_9d8._4_4_ + local_9e8._4_4_,(int)local_9d8 + (int)local_9e8);
  uStack_e10._0_4_ = (int)uStack_9d0 + (int)uStack_9e0;
  uStack_e10._4_4_ = uStack_9d0._4_4_ + uStack_9e0._4_4_;
  local_9f8 = local_e18;
  uStack_9f0 = uStack_e10;
  local_a08 = local_d78;
  iStack_a04 = iStack_d74;
  iStack_a00 = iStack_d70;
  iStack_9fc = iStack_d6c;
  local_e18._0_4_ = (int)local_9d8 + (int)local_9e8 + local_d78;
  local_e18._4_4_ = local_9d8._4_4_ + local_9e8._4_4_ + iStack_d74;
  iVar70 = (int)uStack_9d0 + (int)uStack_9e0 + iStack_d70;
  iVar73 = uStack_9d0._4_4_ + uStack_9e0._4_4_ + iStack_d6c;
  uStack_e10._0_4_ = iVar70;
  uStack_e10._4_4_ = iVar73;
  local_c18 = local_e18;
  uStack_c10 = uStack_e10;
  local_c1c = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_e18._0_4_ = (int)local_e18 >> auVar71;
  local_e18._4_4_ = local_e18._4_4_ >> auVar71;
  uStack_e10._0_4_ = iVar70 >> auVar71;
  uStack_e10._4_4_ = iVar73 >> auVar71;
  local_6d8 = local_eb8._0_8_;
  uStack_6d0 = local_eb8._8_8_;
  local_6e8 = local_ec8._0_8_;
  uStack_6e0 = local_ec8._8_8_;
  local_e08 = CONCAT44(local_9d8._4_4_ - local_9e8._4_4_,(int)local_9d8 - (int)local_9e8);
  uStack_e00._0_4_ = (int)uStack_9d0 - (int)uStack_9e0;
  uStack_e00._4_4_ = uStack_9d0._4_4_ - uStack_9e0._4_4_;
  local_a18 = local_e08;
  uStack_a10 = uStack_e00;
  local_a28 = local_d78;
  iStack_a24 = iStack_d74;
  iStack_a20 = iStack_d70;
  iStack_a1c = iStack_d6c;
  iVar70 = ((int)local_9d8 - (int)local_9e8) + local_d78;
  iVar73 = (local_9d8._4_4_ - local_9e8._4_4_) + iStack_d74;
  iVar74 = ((int)uStack_9d0 - (int)uStack_9e0) + iStack_d70;
  iVar75 = (uStack_9d0._4_4_ - uStack_9e0._4_4_) + iStack_d6c;
  local_e08 = CONCAT44(iVar73,iVar70);
  uStack_e00._0_4_ = iVar74;
  uStack_e00._4_4_ = iVar75;
  local_c38 = local_e08;
  uStack_c30 = uStack_e00;
  local_c3c = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_e08 = CONCAT44(iVar73 >> auVar71,iVar70 >> auVar71);
  uStack_e00._0_4_ = iVar74 >> auVar71;
  uStack_e00._4_4_ = iVar75 >> auVar71;
  local_578 = local_e58;
  uStack_570 = uStack_e50;
  local_588 = local_d68;
  uStack_580 = uStack_d60;
  auVar2._8_8_ = uStack_e50;
  auVar2._0_8_ = local_e58;
  auVar1._8_8_ = uStack_d60;
  auVar1._0_8_ = local_d68;
  local_eb8 = pmulld(auVar2,auVar1);
  local_598 = local_e48;
  uStack_590 = uStack_e40;
  local_5a8 = local_d68;
  uStack_5a0 = uStack_d60;
  auVar72._8_8_ = uStack_e40;
  auVar72._0_8_ = local_e48;
  auVar71._8_8_ = uStack_d60;
  auVar71._0_8_ = local_d68;
  local_ec8 = pmulld(auVar72,auVar71);
  local_a38 = local_eb8._0_8_;
  uVar42 = local_a38;
  uStack_a30 = local_eb8._8_8_;
  uVar43 = uStack_a30;
  local_a48 = local_ec8._0_8_;
  uVar40 = local_a48;
  uStack_a40 = local_ec8._8_8_;
  uVar41 = uStack_a40;
  local_a38._0_4_ = local_eb8._0_4_;
  local_a38._4_4_ = local_eb8._4_4_;
  uStack_a30._0_4_ = local_eb8._8_4_;
  uStack_a30._4_4_ = local_eb8._12_4_;
  local_a48._0_4_ = local_ec8._0_4_;
  local_a48._4_4_ = local_ec8._4_4_;
  uStack_a40._0_4_ = local_ec8._8_4_;
  uStack_a40._4_4_ = local_ec8._12_4_;
  local_dd8 = CONCAT44(local_a38._4_4_ + local_a48._4_4_,(int)local_a38 + (int)local_a48);
  uStack_dd0._0_4_ = (int)uStack_a30 + (int)uStack_a40;
  uStack_dd0._4_4_ = uStack_a30._4_4_ + uStack_a40._4_4_;
  local_a58 = local_dd8;
  uStack_a50 = uStack_dd0;
  local_a68 = local_d78;
  iStack_a64 = iStack_d74;
  iStack_a60 = iStack_d70;
  iStack_a5c = iStack_d6c;
  iVar70 = (int)local_a38 + (int)local_a48 + local_d78;
  iVar73 = local_a38._4_4_ + local_a48._4_4_ + iStack_d74;
  iVar74 = (int)uStack_a30 + (int)uStack_a40 + iStack_d70;
  iVar75 = uStack_a30._4_4_ + uStack_a40._4_4_ + iStack_d6c;
  local_dd8 = CONCAT44(iVar73,iVar70);
  uStack_dd0._0_4_ = iVar74;
  uStack_dd0._4_4_ = iVar75;
  local_c58 = local_dd8;
  uStack_c50 = uStack_dd0;
  local_c5c = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_dd8 = CONCAT44(iVar73 >> auVar71,iVar70 >> auVar71);
  uStack_dd0._0_4_ = iVar74 >> auVar71;
  uStack_dd0._4_4_ = iVar75 >> auVar71;
  local_6f8 = local_eb8._0_8_;
  uStack_6f0 = local_eb8._8_8_;
  local_708 = local_ec8._0_8_;
  uStack_700 = local_ec8._8_8_;
  local_dc8 = CONCAT44(local_a38._4_4_ - local_a48._4_4_,(int)local_a38 - (int)local_a48);
  uStack_dc0._0_4_ = (int)uStack_a30 - (int)uStack_a40;
  uStack_dc0._4_4_ = uStack_a30._4_4_ - uStack_a40._4_4_;
  local_a78 = local_dc8;
  uStack_a70 = uStack_dc0;
  local_a88 = local_d78;
  iStack_a84 = iStack_d74;
  iStack_a80 = iStack_d70;
  iStack_a7c = iStack_d6c;
  local_dc8._0_4_ = ((int)local_a38 - (int)local_a48) + local_d78;
  local_dc8._4_4_ = (local_a38._4_4_ - local_a48._4_4_) + iStack_d74;
  iVar70 = ((int)uStack_a30 - (int)uStack_a40) + iStack_d70;
  iVar73 = (uStack_a30._4_4_ - uStack_a40._4_4_) + iStack_d6c;
  uStack_dc0._0_4_ = iVar70;
  uStack_dc0._4_4_ = iVar73;
  local_c78 = local_dc8;
  uStack_c70 = uStack_dc0;
  local_c7c = local_c94;
  auVar71 = ZEXT416(local_c94);
  local_dc8._0_4_ = (int)local_dc8 >> auVar71;
  local_dc8._4_4_ = local_dc8._4_4_ >> auVar71;
  uStack_dc0._0_4_ = iVar70 >> auVar71;
  uStack_dc0._4_4_ = iVar73 >> auVar71;
  if (local_c98 == 0) {
    if (local_c9c + 6 < 0x10) {
      iVar70 = 0x10;
    }
    else {
      iVar70 = local_c9c + 6;
    }
    local_ecc._0_1_ = (char)iVar70;
    local_5e8 = -(1 << ((char)local_ecc - 1U & 0x1f));
    local_ee8 = CONCAT44(local_5e8,local_5e8);
    uStack_ee0 = CONCAT44(local_5e8,local_5e8);
    local_5ec = (1 << ((char)local_ecc - 1U & 0x1f)) + -1;
    uVar77 = CONCAT44(local_5ec,local_5ec);
    uStack_20 = CONCAT44(local_5ec,local_5ec);
    in0_07[1] = local_c90 + 2;
    in1_07[1] = (longlong)&stack0xfffffffffffff108;
    in1_07[0] = (longlong)&local_ee8;
    in0_07[0] = (longlong)local_c90;
    local_ecc = iVar70;
    local_a48 = uVar40;
    uStack_a40 = uVar41;
    local_a38 = uVar42;
    uStack_a30 = uVar43;
    local_9e8 = uVar44;
    uStack_9e0 = uVar45;
    local_9d8 = uVar46;
    uStack_9d0 = uVar47;
    local_48 = local_ee8;
    uStack_40 = uStack_ee0;
    local_38 = local_5e8;
    local_34 = local_5e8;
    local_30 = local_5e8;
    local_2c = local_5e8;
    local_28 = uVar77;
    local_10 = local_5ec;
    local_c = local_5ec;
    local_8 = local_5ec;
    local_4 = local_5ec;
    neg_shift_sse4_1(in0_07,in1_07,(__m128i *)(ulong)local_ca0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff0f8,
                     (__m128i *)CONCAT44(iVar76,iVar70),local_5ec);
    in0_08[0] = local_c90 + 4;
    in0_08[1] = local_c90 + 6;
    iVar73 = (int)uVar77;
    in1_08[1] = (longlong)&stack0xfffffffffffff108;
    in1_08[0] = (longlong)&local_ee8;
    neg_shift_sse4_1(in0_08,in1_08,(__m128i *)(ulong)local_ca0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff0f8,
                     (__m128i *)CONCAT44(iVar76,iVar70),iVar73);
    in0_09[0] = local_c90 + 8;
    in0_09[1] = local_c90 + 10;
    in1_09[1] = (longlong)&stack0xfffffffffffff108;
    in1_09[0] = (longlong)&local_ee8;
    neg_shift_sse4_1(in0_09,in1_09,(__m128i *)(ulong)local_ca0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff0f8,
                     (__m128i *)CONCAT44(iVar76,iVar70),iVar73);
    in0_10[0] = local_c90 + 0xc;
    in0_10[1] = local_c90 + 0xe;
    in1_10[1] = (longlong)&stack0xfffffffffffff108;
    in1_10[0] = (longlong)&local_ee8;
    neg_shift_sse4_1(in0_10,in1_10,(__m128i *)(ulong)local_ca0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff0f8,
                     (__m128i *)CONCAT44(iVar76,iVar70),iVar73);
  }
  else {
    *local_c90 = uVar77;
    local_c90[1] = uVar39;
    local_718 = (int)local_d88;
    iStack_714 = (int)((ulong)local_d88 >> 0x20);
    iStack_710 = (int)uStack_d80;
    iStack_70c = (int)((ulong)uStack_d80 >> 0x20);
    local_728 = (int)local_e78;
    iStack_724 = (int)((ulong)local_e78 >> 0x20);
    iStack_720 = (int)uStack_e70;
    iStack_71c = (int)((ulong)uStack_e70 >> 0x20);
    *(int *)(local_c90 + 2) = local_718 - local_728;
    *(int *)((long)local_c90 + 0x14) = iStack_714 - iStack_724;
    *(int *)(local_c90 + 3) = iStack_710 - iStack_720;
    *(int *)((long)local_c90 + 0x1c) = iStack_70c - iStack_71c;
    local_c90[4] = local_dd8;
    local_c90[5] = uStack_dd0;
    *(int *)(local_c90 + 6) = local_718 - (int)local_e18;
    *(int *)((long)local_c90 + 0x34) = iStack_714 - local_e18._4_4_;
    *(int *)(local_c90 + 7) = iStack_710 - (int)uStack_e10;
    *(int *)((long)local_c90 + 0x3c) = iStack_70c - uStack_e10._4_4_;
    local_c90[8] = local_e08;
    local_c90[9] = uStack_e00;
    *(int *)(local_c90 + 10) = local_718 - (int)local_dc8;
    *(int *)((long)local_c90 + 0x54) = iStack_714 - local_dc8._4_4_;
    *(int *)(local_c90 + 0xb) = iStack_710 - (int)uStack_dc0;
    *(int *)((long)local_c90 + 0x5c) = iStack_70c - uStack_dc0._4_4_;
    local_c90[0xc] = local_e68;
    local_c90[0xd] = uStack_e60;
    local_788 = (int)local_ea8._0_8_;
    iStack_784 = SUB84(local_ea8._0_8_,4);
    iStack_780 = (int)local_ea8._8_8_;
    iStack_77c = SUB84(local_ea8._8_8_,4);
    *(int *)(local_c90 + 0xe) = local_718 - local_788;
    *(int *)((long)local_c90 + 0x74) = iStack_714 - iStack_784;
    *(int *)(local_c90 + 0xf) = iStack_710 - iStack_780;
    *(int *)((long)local_c90 + 0x7c) = iStack_70c - iStack_77c;
  }
  return;
}

Assistant:

static void iadst8x8_new_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                                int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[8], v[8], x;

  // stage 0
  // stage 1
  // stage 2

  u[0] = _mm_mullo_epi32(in[7], cospi4);
  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[7], cospi60);
  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[5], cospi20);
  x = _mm_mullo_epi32(in[2], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[5], cospi44);
  x = _mm_mullo_epi32(in[2], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[3], cospi36);
  x = _mm_mullo_epi32(in[4], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[3], cospi28);
  x = _mm_mullo_epi32(in[4], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[1], cospi52);
  x = _mm_mullo_epi32(in[6], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[1], cospi12);
  x = _mm_mullo_epi32(in[6], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
  }
}